

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# acbPush.c
# Opt level: O0

void Acb_ObjPushToFanout(Acb_Ntk_t *p,int iObj,int iFaninIndex,int iFanout)

{
  int iVar1;
  int iFaninGiven;
  int iVar;
  int iVar2;
  int iVar3;
  word wVar4;
  word wVar5;
  ulong uVar6;
  Vec_Wrd_t *p_00;
  int local_68;
  int iFanoutFaninIndex;
  int iFanoutObjIndex;
  int iFanin;
  int DecType;
  word uTruthFan;
  word uTruthFanNew;
  word c1;
  word Gate;
  word uTruthObj;
  word uTruthObjNew;
  word c0;
  int local_18;
  int iFanout_local;
  int iFaninIndex_local;
  int iObj_local;
  Acb_Ntk_t *p_local;
  
  uTruthObj = 0;
  c0._4_4_ = iFanout;
  local_18 = iFaninIndex;
  iFanout_local = iObj;
  _iFaninIndex_local = p;
  wVar4 = Acb_ObjTruth(p,iObj);
  wVar5 = Acb_ObjTruth(_iFaninIndex_local,c0._4_4_);
  iVar1 = Abc_Tt6CheckOutDec(wVar4,local_18,&uTruthObj);
  iFaninGiven = Acb_ObjFanin(_iFaninIndex_local,iFanout_local,local_18);
  iVar = Acb_ObjWhatFanin(_iFaninIndex_local,c0._4_4_,iFanout_local);
  local_68 = Acb_ObjWhatFanin(_iFaninIndex_local,c0._4_4_,iFaninGiven);
  if (local_68 == -1) {
    local_68 = Acb_ObjFaninNum(_iFaninIndex_local,c0._4_4_);
  }
  iVar2 = Acb_ObjIsCio(_iFaninIndex_local,iFanout_local);
  if (iVar2 != 0) {
    __assert_fail("!Acb_ObjIsCio(p, iObj)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/base/acb/acbPush.c"
                  ,0x37,"void Acb_ObjPushToFanout(Acb_Ntk_t *, int, int, int)");
  }
  iVar3 = Acb_ObjIsCio(_iFaninIndex_local,c0._4_4_);
  iVar2 = local_18;
  if (iVar3 != 0) {
    __assert_fail("!Acb_ObjIsCio(p, iFanout)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/base/acb/acbPush.c"
                  ,0x38,"void Acb_ObjPushToFanout(Acb_Ntk_t *, int, int, int)");
  }
  if (local_68 < 0) {
    __assert_fail("iFanoutFaninIndex >= 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/base/acb/acbPush.c"
                  ,0x39,"void Acb_ObjPushToFanout(Acb_Ntk_t *, int, int, int)");
  }
  iVar3 = Acb_ObjFaninNum(_iFaninIndex_local,iFanout_local);
  if (iVar3 <= iVar2) {
    __assert_fail("iFaninIndex < Acb_ObjFaninNum(p, iObj)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/base/acb/acbPush.c"
                  ,0x3a,"void Acb_ObjPushToFanout(Acb_Ntk_t *, int, int, int)");
  }
  iVar2 = Acb_ObjFanoutNum(_iFaninIndex_local,iFanout_local);
  if (iVar2 != 1) {
    __assert_fail("Acb_ObjFanoutNum(p, iObj) == 1",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/base/acb/acbPush.c"
                  ,0x3b,"void Acb_ObjPushToFanout(Acb_Ntk_t *, int, int, int)");
  }
  uTruthObjNew = Abc_Tt6Cofactor0(wVar5,iVar);
  wVar4 = Abc_Tt6Cofactor1(wVar5,iVar);
  iVar2 = iFanout_local;
  if (iVar1 == 0) {
    c1 = s_Truths6[local_68] & s_Truths6[iVar];
  }
  else if (iVar1 == 1) {
    c1 = (s_Truths6[local_68] ^ 0xffffffffffffffff) & s_Truths6[iVar];
  }
  else if (iVar1 == 2) {
    c1 = s_Truths6[local_68] ^ 0xffffffffffffffff | s_Truths6[iVar];
  }
  else if (iVar1 == 3) {
    c1 = s_Truths6[local_68] | s_Truths6[iVar];
  }
  else {
    if (iVar1 != 4) {
      __assert_fail("0",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/base/acb/acbPush.c"
                    ,0x49,"void Acb_ObjPushToFanout(Acb_Ntk_t *, int, int, int)");
    }
    c1 = s_Truths6[local_68] ^ s_Truths6[iVar];
  }
  uVar6 = (c1 ^ 0xffffffffffffffff) & uTruthObjNew;
  p_00 = &_iFaninIndex_local->vObjTruth;
  wVar5 = Abc_Tt6RemoveVar(uTruthObj,local_18);
  Vec_WrdWriteEntry(p_00,iVar2,wVar5);
  Vec_WrdWriteEntry(&_iFaninIndex_local->vObjTruth,c0._4_4_,uVar6 | c1 & wVar4);
  Acb_ObjRemoveFaninFanoutOne(_iFaninIndex_local,iFanout_local,iFaninGiven);
  iVar1 = Acb_ObjFaninNum(_iFaninIndex_local,c0._4_4_);
  if (local_68 == iVar1) {
    Acb_ObjAddFaninFanoutOne(_iFaninIndex_local,c0._4_4_,iFaninGiven);
  }
  return;
}

Assistant:

ABC_NAMESPACE_IMPL_START

////////////////////////////////////////////////////////////////////////
///                        DECLARATIONS                              ///
////////////////////////////////////////////////////////////////////////

////////////////////////////////////////////////////////////////////////
///                     FUNCTION DEFINITIONS                         ///
////////////////////////////////////////////////////////////////////////

/**Function*************************************************************

  Synopsis    [Pushing logic to the fanout.]

  Description []
               
  SideEffects []

  SeeAlso     []

***********************************************************************/
void Acb_ObjPushToFanout( Acb_Ntk_t * p, int iObj, int iFaninIndex, int iFanout )
{
    word c0, uTruthObjNew = 0, uTruthObj = Acb_ObjTruth( p, iObj ), Gate;
    word c1, uTruthFanNew = 0, uTruthFan = Acb_ObjTruth( p, iFanout );
    int DecType = Abc_Tt6CheckOutDec( uTruthObj, iFaninIndex, &uTruthObjNew );
    int iFanin = Acb_ObjFanin( p, iObj, iFaninIndex );
    int iFanoutObjIndex = Acb_ObjWhatFanin( p, iFanout, iObj );
    int iFanoutFaninIndex = Acb_ObjWhatFanin( p, iFanout, iFanin );
    if ( iFanoutFaninIndex == -1 )
        iFanoutFaninIndex = Acb_ObjFaninNum(p, iFanout); 
    assert( !Acb_ObjIsCio(p, iObj) );
    assert( !Acb_ObjIsCio(p, iFanout) );
    assert( iFanoutFaninIndex >= 0 );
    assert( iFaninIndex < Acb_ObjFaninNum(p, iObj) );
    assert( Acb_ObjFanoutNum(p, iObj) == 1 );
    // compute new function of the fanout
    c0 = Abc_Tt6Cofactor0( uTruthFan, iFanoutObjIndex );
    c1 = Abc_Tt6Cofactor1( uTruthFan, iFanoutObjIndex );
    if ( DecType == 0 ) //  F = i * G
        Gate =  s_Truths6[iFanoutFaninIndex] & s_Truths6[iFanoutObjIndex];
    else if ( DecType == 1 ) //  F = ~i * G
        Gate = ~s_Truths6[iFanoutFaninIndex] & s_Truths6[iFanoutObjIndex];
    else if ( DecType == 2 ) //  F = ~i + G
        Gate = ~s_Truths6[iFanoutFaninIndex] | s_Truths6[iFanoutObjIndex];
    else if ( DecType == 3 ) //  F = i + G
        Gate =  s_Truths6[iFanoutFaninIndex] | s_Truths6[iFanoutObjIndex];
    else if ( DecType == 4 ) //  F = i # G
        Gate =  s_Truths6[iFanoutFaninIndex] ^ s_Truths6[iFanoutObjIndex];
    else assert( 0 );
    uTruthFanNew = (~Gate & c0) | (Gate & c1);
    // update functions
    Vec_WrdWriteEntry( &p->vObjTruth, iObj, Abc_Tt6RemoveVar(uTruthObjNew, iFaninIndex) );
    Vec_WrdWriteEntry( &p->vObjTruth, iFanout, uTruthFanNew );
    // update fanins
    Acb_ObjRemoveFaninFanoutOne( p, iObj, iFanin );
    if ( iFanoutFaninIndex == Acb_ObjFaninNum(p, iFanout) ) // adding new
        Acb_ObjAddFaninFanoutOne( p, iFanout, iFanin );
}